

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> * __thiscall
dg::vr::ValueRelations::getDirectlyRelated(ValueRelations *this,V val,Relations *rels)

{
  HandlePtr relations;
  Bucket *in_RCX;
  RelationsGraph<dg::vr::ValueRelations> *in_RDX;
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
  in_RSI;
  anon_class_8_1_8991fb9c in_RDI;
  RelationsMap related;
  HandlePtr mH;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *result;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_stack_ffffffffffffff58;
  back_insert_iterator<std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  __result;
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
  in_stack_ffffffffffffff78;
  ValueRelations *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffffd7;
  
  __result.container =
       (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)in_RDI.this;
  relations = maybeGet(in_stack_ffffffffffffff80,(V)in_stack_ffffffffffffff78._M_node);
  if (relations == (HandlePtr)0x0) {
    memset(in_RDI.this,0,0x18);
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)0x20975c);
  }
  else {
    RelationsGraph<dg::vr::ValueRelations>::getRelated
              (in_RDX,in_RCX,(Relations *)relations,(bool)in_stack_ffffffffffffffd7);
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)0x209795);
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::begin(in_stack_ffffffffffffff58);
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::end(in_stack_ffffffffffffff58);
    std::back_inserter<std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               in_stack_ffffffffffffff58);
    std::
    transform<std::_Rb_tree_iterator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>,std::back_insert_iterator<std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,dg::vr::ValueRelations::getDirectlyRelated(llvm::Value_const*,dg::vr::Relations_const&)const::__0>
              (in_stack_ffffffffffffff78,in_RSI,__result,in_RDI);
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
            *)0x20980d);
  }
  return (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
         (ValueRelations *)__result.container;
}

Assistant:

std::vector<ValueRelations::V>
ValueRelations::getDirectlyRelated(V val, const Relations &rels) const {
    HandlePtr mH = maybeGet(val);
    if (!mH)
        return {};
    RelationsMap related = graph.getRelated(*mH, rels, true);

    std::vector<ValueRelations::V> result;
    std::transform(related.begin(), related.end(), std::back_inserter(result),
                   [this](const RelationsMap::value_type &pair) {
                       return this->getAny(pair.first);
                   });
    return result;
}